

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

void add_pax_attr(archive_string *as,char *key,char *value)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *p;
  uint uVar4;
  int iVar5;
  char tmp [13];
  
  sVar2 = strlen(key);
  sVar3 = strlen(value);
  iVar5 = 1;
  uVar4 = (int)sVar2 + (int)sVar3 + 3;
  for (uVar1 = uVar4; 0 < (int)uVar1; uVar1 = uVar1 / 10) {
    iVar5 = iVar5 * 10;
    uVar4 = uVar4 + 1;
  }
  tmp[0xc] = '\0';
  p = format_int(tmp + 0xc,(long)(int)((iVar5 <= (int)uVar4) + uVar4));
  archive_strcat(as,p);
  archive_strappend_char(as,' ');
  archive_strcat(as,key);
  archive_strappend_char(as,'=');
  archive_strcat(as,value);
  archive_strappend_char(as,'\n');
  return;
}

Assistant:

static void
add_pax_attr(struct archive_string *as, const char *key, const char *value)
{
	int digits, i, len, next_ten;
	char tmp[1 + 3 * sizeof(int)];	/* < 3 base-10 digits per byte */

	/*-
	 * PAX attributes have the following layout:
	 *     <len> <space> <key> <=> <value> <nl>
	 */
	len = 1 + (int)strlen(key) + 1 + (int)strlen(value) + 1;

	/*
	 * The <len> field includes the length of the <len> field, so
	 * computing the correct length is tricky.  I start by
	 * counting the number of base-10 digits in 'len' and
	 * computing the next higher power of 10.
	 */
	next_ten = 1;
	digits = 0;
	i = len;
	while (i > 0) {
		i = i / 10;
		digits++;
		next_ten = next_ten * 10;
	}
	/*
	 * For example, if string without the length field is 99
	 * chars, then adding the 2 digit length "99" will force the
	 * total length past 100, requiring an extra digit.  The next
	 * statement adjusts for this effect.
	 */
	if (len + digits >= next_ten)
		digits++;

	/* Now, we have the right length so we can build the line. */
	tmp[sizeof(tmp) - 1] = 0;	/* Null-terminate the work area. */
	archive_strcat(as, format_int(tmp + sizeof(tmp) - 1, len + digits));
	archive_strappend_char(as, ' ');
	archive_strcat(as, key);
	archive_strappend_char(as, '=');
	archive_strcat(as, value);
	archive_strappend_char(as, '\n');
}